

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

Matrix4x4 * __thiscall
CMU462::DynamicScene::Joint::getBindTransformation(Matrix4x4 *__return_storage_ptr__,Joint *this)

{
  long lVar1;
  Matrix4x4 *pMVar2;
  Matrix4x4 *pMVar3;
  Joint *pJVar4;
  byte bVar5;
  Vector3D local_168;
  Vector3D local_148;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  bVar5 = 0;
  Matrix4x4::identity();
  pJVar4 = this;
  while (pJVar4 = pJVar4->parent, pJVar4 != (Joint *)0x0) {
    local_168.x = (pJVar4->axis).x;
    local_168.y = (pJVar4->axis).y;
    local_168.z = (pJVar4->axis).z;
    Matrix4x4::translation(&local_168);
    Matrix4x4::operator*(&local_b0,&local_130,__return_storage_ptr__);
    pMVar2 = &local_b0;
    pMVar3 = __return_storage_ptr__;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pMVar3->entries[0].x = pMVar2->entries[0].x;
      pMVar2 = (Matrix4x4 *)((long)pMVar2 + ((ulong)bVar5 * -2 + 1) * 8);
      pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    }
  }
  pJVar4 = this->skeleton->root;
  local_148.x = (pJVar4->super_SceneObject).position.x;
  local_148.y = (pJVar4->super_SceneObject).position.y;
  local_148.z = (pJVar4->super_SceneObject).position.z;
  Matrix4x4::translation(&local_148);
  Matrix4x4::operator*(&local_b0,&local_130,__return_storage_ptr__);
  pMVar2 = &local_b0;
  pMVar3 = __return_storage_ptr__;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pMVar3->entries[0].x = pMVar2->entries[0].x;
    pMVar2 = (Matrix4x4 *)((long)pMVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Joint::getBindTransformation() {
  Matrix4x4 T = Matrix4x4::identity();
  for (Joint* j = parent; j != nullptr; j = j->parent) {
    T = Matrix4x4::translation(j->axis) * T;
  }

  // Allow skeleton translation by taking root's position into account
  T = Matrix4x4::translation(skeleton->root->position) * T;

  return T;
}